

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.h
# Opt level: O2

string * __thiscall
xLearn::CrossEntropyLoss::loss_type_abi_cxx11_
          (string *__return_storage_ptr__,CrossEntropyLoss *this)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"log_loss",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string loss_type() { return "log_loss"; }